

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

EdgeDescriptorSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EdgeDescriptorSyntax,slang::syntax::EdgeDescriptorSyntax_const&>
          (BumpAllocator *this,EdgeDescriptorSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  undefined4 uVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  EdgeDescriptorSyntax *pEVar13;
  
  pEVar13 = (EdgeDescriptorSyntax *)allocate(this,0x38,8);
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar5 = (args->t1).kind;
  uVar6 = (args->t1).field_0x2;
  NVar7.raw = (args->t1).numFlags.raw;
  uVar8 = (args->t1).rawLen;
  pIVar3 = (args->t1).info;
  TVar9 = (args->t2).kind;
  uVar10 = (args->t2).field_0x2;
  NVar11.raw = (args->t2).numFlags.raw;
  uVar12 = (args->t2).rawLen;
  (pEVar13->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pEVar13->super_SyntaxNode).field_0x4 = uVar4;
  (pEVar13->super_SyntaxNode).parent = pSVar1;
  (pEVar13->super_SyntaxNode).previewNode = pSVar2;
  (pEVar13->t1).kind = TVar5;
  (pEVar13->t1).field_0x2 = uVar6;
  (pEVar13->t1).numFlags = (NumericTokenFlags)NVar7.raw;
  (pEVar13->t1).rawLen = uVar8;
  (pEVar13->t1).info = pIVar3;
  (pEVar13->t2).kind = TVar9;
  (pEVar13->t2).field_0x2 = uVar10;
  (pEVar13->t2).numFlags = (NumericTokenFlags)NVar11.raw;
  (pEVar13->t2).rawLen = uVar12;
  (pEVar13->t2).info = (args->t2).info;
  return pEVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }